

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanio.c
# Opt level: O0

void Abc_ObjRemoveFanins(Abc_Obj_t *pObj)

{
  Abc_Obj_t *pFanin_00;
  int local_24;
  int k;
  Abc_Obj_t *pFanin;
  Vec_Int_t *vFaninsOld;
  Abc_Obj_t *pObj_local;
  
  local_24 = (pObj->vFanins).nSize;
  while (local_24 = local_24 + -1, -1 < local_24) {
    pFanin_00 = Abc_NtkObj(pObj->pNtk,(pObj->vFanins).pArray[local_24]);
    Abc_ObjDeleteFanin(pObj,pFanin_00);
  }
  *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xfffffbff;
  *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xfffff7ff;
  if ((pObj->vFanins).nSize == 0) {
    return;
  }
  __assert_fail("vFaninsOld->nSize == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                ,0x9b,"void Abc_ObjRemoveFanins(Abc_Obj_t *)");
}

Assistant:

void Abc_ObjRemoveFanins( Abc_Obj_t * pObj )
{
    Vec_Int_t * vFaninsOld;
    Abc_Obj_t * pFanin;
    int k;
    // remove old fanins
    vFaninsOld = &pObj->vFanins;
    for ( k = vFaninsOld->nSize - 1; k >= 0; k-- )
    {
        pFanin = Abc_NtkObj( pObj->pNtk, vFaninsOld->pArray[k] );
        Abc_ObjDeleteFanin( pObj, pFanin );
    }
    pObj->fCompl0 = 0;
    pObj->fCompl1 = 0;
    assert( vFaninsOld->nSize == 0 );
}